

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPGEX_TransformedView.h
# Opt level: O2

void __thiscall
olc::TransformedView::DrawSprite
          (TransformedView *this,vf2d *pos,Sprite *sprite,vf2d *scale,uint8_t flip)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long *plVar3;
  int iVar4;
  Pixel PVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  vi2d vStart;
  float local_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  undefined8 uStack_40;
  
  uVar1 = sprite->width;
  uVar2 = sprite->height;
  local_48 = (float)(int)uVar1;
  fStack_44 = (float)(int)uVar2;
  uStack_40 = 0;
  local_50 = (*scale).x * local_48;
  fStack_4c = (*scale).y * fStack_44;
  iVar4 = (*(this->super_PGEX)._vptr_PGEX[10])();
  if ((char)iVar4 != '\0') {
    fVar9 = (this->m_vRecipPixel).x * local_48 * (this->m_vWorldScale).x * scale->x;
    local_48 = fStack_44 * (this->m_vRecipPixel).y * (this->m_vWorldScale).y * scale->y;
    uStack_40 = CONCAT44(fStack_44,fStack_44);
    (*(this->super_PGEX)._vptr_PGEX[5])(&local_50,this,pos);
    fVar8 = (float)(int)local_50;
    fVar10 = (float)(int)fStack_4c + local_48;
    _local_48 = CONCAT44(fStack_44,1.0 / local_48);
    for (fVar6 = fStack_4c; fVar7 = local_50, (int)fVar6 < (int)fVar10;
        fVar6 = (float)((int)fVar6 + 1)) {
      for (; plVar3 = PGEX::pge, (int)fVar7 < (int)(fVar8 + fVar9); fVar7 = (float)((int)fVar7 + 1))
      {
        PVar5 = Sprite::Sample(sprite,(float)((int)fVar7 - (int)local_50) * (1.0 / fVar9),
                               (float)((int)fVar6 - (int)fStack_4c) * local_48);
        (**(code **)(*plVar3 + 0x28))(plVar3,fVar7,fVar6,PVar5.field_0);
      }
    }
  }
  return;
}

Assistant:

void TransformedView::DrawSprite(const olc::vf2d & pos, olc::Sprite * sprite, const olc::vf2d & scale, uint8_t flip)
	{
		olc::vf2d vSpriteSize = olc::vf2d(float(sprite->width), float(sprite->height));
		if (IsRectVisible(pos, vSpriteSize * scale))
		{
			olc::vf2d vSpriteScaledSize = vSpriteSize * m_vRecipPixel * m_vWorldScale * scale;
			olc::vi2d vPixel, vStart = WorldToScreen(pos), vEnd = vSpriteScaledSize + vStart;
			olc::vf2d vPixelStep = 1.0f / vSpriteScaledSize;
			for (vPixel.y = vStart.y; vPixel.y < vEnd.y; vPixel.y++)
			{
				for (vPixel.x = vStart.x; vPixel.x < vEnd.x; vPixel.x++)
				{
					olc::vf2d vSample = olc::vf2d(vPixel - vStart) * vPixelStep;
					pge->Draw(vPixel, sprite->Sample(vSample.x, vSample.y));
				}
			}
		}
	}